

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.cpp
# Opt level: O1

void __thiscall SoapySDR::Registry::~Registry(Registry *this)

{
  pointer pcVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
  pVar2;
  
  if ((this->_name)._M_string_length != 0) {
    getFunctionTable_abi_cxx11_();
    pVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
            ::equal_range(&getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t,&this->_name);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
    ::_M_erase_aux(&getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t,
                   (_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
  }
  pcVar1 = (this->_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

SoapySDR::Registry::~Registry(void)
{
    //erase entry
    if (_name.empty()) return;
    getFunctionTable().erase(_name);
}